

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_x_msb.c
# Opt level: O2

void mgga_x_msb_init(xc_func_type *p)

{
  int iVar1;
  undefined4 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  
  puVar2 = (undefined4 *)malloc(0x18);
  p->params = puVar2;
  iVar1 = p->info->number;
  if (iVar1 == 300) {
    uVar3 = 0x9ba5e354;
    uVar4 = 0x3fe020c4;
    uVar5 = 0xf8769ec3;
    uVar6 = 0x3fc2b26b;
    uVar7 = 0x3ff8c00000000000;
  }
  else {
    if (iVar1 != 0x12d) {
      fwrite("Internal error in mgga_x_msb\n",0x1d,1,_stderr);
      exit(1);
    }
    uVar3 = 0x4c2f837b;
    uVar4 = 0x3fe40aa6;
    uVar5 = 0xdbdf8f47;
    uVar6 = 0x3fbf67f4;
    uVar7 = 0x401134538ef34d6a;
  }
  *(undefined8 *)(puVar2 + 4) = uVar7;
  *puVar2 = uVar3;
  puVar2[1] = uVar4;
  puVar2[2] = uVar5;
  puVar2[3] = uVar6;
  return;
}

Assistant:

static void
mgga_x_msb_init(xc_func_type *p)
{
  mgga_x_msb_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(mgga_x_msb_params));
  params = (mgga_x_msb_params *)p->params;

  switch(p->info->number){
  case XC_MGGA_X_MS2B:
    params->kappa = 0.504;
    params->b     = (27.0*4.0 - 9.0)/64.0;
    params->c     = 0.14607;
    break;
  case XC_MGGA_X_MS2BS:
    params->kappa = 0.6263;
    params->b     = 4.3011;
    params->c     = 0.12268;
    break;
  default:
    fprintf(stderr, "Internal error in mgga_x_msb\n");
    exit(1);
  }
}